

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O2

LispPTR subr_TCP_ops(int op,LispPTR nameConn,LispPTR proto,LispPTR length,LispPTR bufaddr,
                    LispPTR maxlen)

{
  byte bVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  LispPTR LVar7;
  uint uVar8;
  ulong uVar9;
  hostent *phVar10;
  servent *psVar11;
  ssize_t sVar12;
  LispPTR *pLVar13;
  int *piVar14;
  uint *puVar15;
  long lVar16;
  long lVar17;
  DLword *pDVar18;
  uint uVar19;
  size_t x;
  char *pcVar20;
  uint uVar21;
  ushort uVar22;
  LispPTR LVar23;
  uint ures;
  char servstring [50];
  char namestring [100];
  
  uVar21 = op & 0xffff;
  switch(uVar21) {
  case 0:
    pLVar13 = NativeAligned4FromLAddr(nameConn);
    LVar7 = 100;
    if ((int)pLVar13[2] < 100) {
      LVar7 = pLVar13[2];
    }
    lVar17 = (long)(int)LVar7;
    if (*(char *)((long)pLVar13 + 6) == 'D') {
      pDVar18 = Lisp_world + (ulong)(ushort)pLVar13[1] + (ulong)(*pLVar13 & 0xfffffff);
      for (lVar16 = 0; lVar17 != lVar16; lVar16 = lVar16 + 1) {
        namestring[lVar16] = *(char *)((ulong)pDVar18 ^ 2);
        pDVar18 = pDVar18 + 1;
      }
      namestring[lVar16] = '\0';
    }
    else if (*(char *)((long)pLVar13 + 6) == 'C') {
      uVar21 = *pLVar13;
      LVar7 = pLVar13[1];
      for (lVar16 = 0; lVar17 != lVar16; lVar16 = lVar16 + 1) {
        namestring[lVar16] =
             *(char *)((long)Lisp_world +
                       lVar16 + (ulong)(ushort)LVar7 + (ulong)(uVar21 & 0xfffffff) * 2 ^ 3);
      }
      namestring[lVar17] = '\0';
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    phVar10 = gethostbyname(namestring);
    if (phVar10 == (hostent *)0x0) {
      return 0;
    }
    uVar21 = *(uint *)*phVar10->h_addr_list;
    uVar8 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8;
    uVar6 = (uVar21 & 0xff00) << 8;
    uVar19 = uVar8 | uVar6 | uVar21 << 0x18;
    uVar6 = uVar6 | uVar21 << 0x18;
    if (uVar6 == 0xffff0000) {
      return uVar8 | 0xf0000;
    }
    if (uVar6 != 0) {
      puVar15 = (uint *)createcell68k(2);
      *puVar15 = uVar19;
      if (((ulong)puVar15 & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",puVar15);
      }
      return (LispPTR)((ulong)((long)puVar15 - (long)Lisp_world) >> 1);
    }
    return uVar19 | 0xe0000;
  case 1:
    pLVar13 = NativeAligned4FromLAddr(nameConn);
    LVar7 = 100;
    if ((int)pLVar13[2] < 100) {
      LVar7 = pLVar13[2];
    }
    lVar17 = (long)(int)LVar7;
    if (*(char *)((long)pLVar13 + 6) == 'D') {
      pDVar18 = Lisp_world + (ulong)(ushort)pLVar13[1] + (ulong)(*pLVar13 & 0xfffffff);
      for (lVar16 = 0; lVar17 != lVar16; lVar16 = lVar16 + 1) {
        namestring[lVar16] = *(char *)((ulong)pDVar18 ^ 2);
        pDVar18 = pDVar18 + 1;
      }
      namestring[lVar16] = '\0';
    }
    else if (*(char *)((long)pLVar13 + 6) == 'C') {
      uVar21 = *pLVar13;
      LVar7 = pLVar13[1];
      for (lVar16 = 0; lVar17 != lVar16; lVar16 = lVar16 + 1) {
        namestring[lVar16] =
             *(char *)((long)Lisp_world +
                       lVar16 + (ulong)(ushort)LVar7 + (ulong)(uVar21 & 0xfffffff) * 2 ^ 3);
      }
      namestring[lVar17] = '\0';
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    pLVar13 = NativeAligned4FromLAddr(proto);
    LVar7 = 0x32;
    if ((int)pLVar13[2] < 0x32) {
      LVar7 = pLVar13[2];
    }
    lVar17 = (long)(int)LVar7;
    if (*(char *)((long)pLVar13 + 6) == 'D') {
      pDVar18 = Lisp_world + (ulong)(ushort)pLVar13[1] + (ulong)(*pLVar13 & 0xfffffff);
      for (lVar16 = 0; lVar17 != lVar16; lVar16 = lVar16 + 1) {
        servstring[lVar16] = *(char *)((ulong)pDVar18 ^ 2);
        pDVar18 = pDVar18 + 1;
      }
      servstring[lVar16] = '\0';
    }
    else if (*(char *)((long)pLVar13 + 6) == 'C') {
      uVar21 = *pLVar13;
      LVar7 = pLVar13[1];
      for (lVar16 = 0; lVar17 != lVar16; lVar16 = lVar16 + 1) {
        servstring[lVar16] =
             *(char *)((long)Lisp_world +
                       lVar16 + (ulong)(ushort)LVar7 + (ulong)(uVar21 & 0xfffffff) * 2 ^ 3);
      }
      servstring[lVar17] = '\0';
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    psVar11 = getservbyname(namestring,servstring);
    if (psVar11 == (servent *)0x0) {
      return 0;
    }
    uVar22 = (ushort)psVar11->s_port;
    x = (size_t)(ushort)(uVar22 << 8 | uVar22 >> 8);
    break;
  case 2:
    if ((nameConn & 0xfff0000) == 0xf0000) {
      LVar7 = nameConn | 0xffff0000;
    }
    else if ((nameConn & 0xfff0000) == 0xe0000) {
      LVar7 = nameConn & 0xffff;
    }
    else {
      pLVar13 = NativeAligned4FromLAddr(nameConn);
      LVar7 = *pLVar13;
    }
    if ((proto & 0xfff0000) == 0xf0000) {
      LVar23 = proto | 0xffff0000;
    }
    else if ((proto & 0xfff0000) == 0xe0000) {
      LVar23 = proto & 0xffff;
    }
    else {
      pLVar13 = NativeAligned4FromLAddr(proto);
      LVar23 = *pLVar13;
    }
    iVar4 = socket(LVar7,LVar23,0);
    uVar21 = fcntl(iVar4,3,0);
    fcntl(iVar4,4,(ulong)(uVar21 | 0x2800));
    uVar21 = getpid();
    fcntl(iVar4,8,(ulong)uVar21);
    uVar9 = (ulong)iVar4;
    goto LAB_0012188f;
  case 3:
    if ((nameConn & 0xfff0000) == 0xf0000) {
      LVar7 = nameConn | 0xffff0000;
    }
    else if ((nameConn & 0xfff0000) == 0xe0000) {
      LVar7 = nameConn & 0xffff;
    }
    else {
      pLVar13 = NativeAligned4FromLAddr(nameConn);
      LVar7 = *pLVar13;
    }
    bVar1 = (byte)LVar7 & 0x3f;
    uVar9 = -2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1;
    LispIOFds.__fds_bits[(int)LVar7 / 0x40] = LispIOFds.__fds_bits[(int)LVar7 / 0x40] & uVar9;
    LispReadFds.__fds_bits[(int)LVar7 / 0x40] = LispReadFds.__fds_bits[(int)LVar7 / 0x40] & uVar9;
    shutdown(LVar7,2);
    close(LVar7);
    return 0x4c;
  case 4:
    servstring[0] = '\0';
    servstring[1] = '\0';
    servstring[2] = '\0';
    servstring[3] = '\0';
    servstring[4] = '\0';
    servstring[5] = '\0';
    servstring[6] = '\0';
    servstring[7] = '\0';
    servstring[8] = '\0';
    servstring[9] = '\0';
    servstring[10] = '\0';
    servstring[0xb] = '\0';
    servstring[0xc] = '\0';
    servstring[0xd] = '\0';
    servstring[0xe] = '\0';
    servstring[0xf] = '\0';
    if ((nameConn & 0xfff0000) == 0xf0000) {
      LVar7 = nameConn | 0xffff0000;
LAB_001211b8:
      uVar21 = LVar7 >> 0x18 | (LVar7 & 0xff0000) >> 8 | (LVar7 & 0xff00) << 8 | LVar7 << 0x18;
      servstring[4] = (char)uVar21;
      servstring[5] = (char)(uVar21 >> 8);
      servstring[6] = (char)(uVar21 >> 0x10);
      servstring[7] = (char)(uVar21 >> 0x18);
    }
    else {
      if ((nameConn & 0xfff0000) == 0xe0000) {
        LVar7 = nameConn & 0xffff;
        goto LAB_001211b8;
      }
      uVar22 = *(ushort *)((ulong)(nameConn >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2);
      pLVar13 = NativeAligned4FromLAddr(nameConn);
      if ((uVar22 & 0x7ff) == 2) {
        LVar7 = *pLVar13;
        goto LAB_001211b8;
      }
      LVar7 = 100;
      if ((int)pLVar13[2] < 100) {
        LVar7 = pLVar13[2];
      }
      lVar17 = (long)(int)LVar7;
      if (*(char *)((long)pLVar13 + 6) == 'D') {
        pDVar18 = Lisp_world + (ulong)(ushort)pLVar13[1] + (ulong)(*pLVar13 & 0xfffffff);
        for (lVar16 = 0; lVar17 != lVar16; lVar16 = lVar16 + 1) {
          namestring[lVar16] = *(char *)((ulong)pDVar18 ^ 2);
          pDVar18 = pDVar18 + 1;
        }
        namestring[lVar16] = '\0';
      }
      else if (*(char *)((long)pLVar13 + 6) == 'C') {
        uVar21 = *pLVar13;
        LVar7 = pLVar13[1];
        for (lVar16 = 0; lVar17 != lVar16; lVar16 = lVar16 + 1) {
          namestring[lVar16] =
               *(char *)((long)Lisp_world +
                         lVar16 + (ulong)(ushort)LVar7 + (ulong)(uVar21 & 0xfffffff) * 2 ^ 3);
        }
        namestring[lVar17] = '\0';
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      phVar10 = gethostbyname(namestring);
      if (phVar10 == (hostent *)0x0) {
        return 0;
      }
      memcpy(servstring + 4,*phVar10->h_addr_list,(long)phVar10->h_length);
    }
    if ((proto & 0xfff0000 | 0x10000) != 0xf0000) {
      pLVar13 = NativeAligned4FromLAddr(proto);
      proto = *pLVar13;
    }
    iVar4 = socket(2,1,0);
    uVar22 = (ushort)proto << 8 | (ushort)proto >> 8;
    servstring[2] = (char)uVar22;
    servstring[3] = (char)(uVar22 >> 8);
    servstring[0] = '\x02';
    servstring[1] = '\0';
    iVar5 = connect(iVar4,(sockaddr *)servstring,0x10);
    if (iVar5 < 0) {
      pcVar20 = "TCP connect";
LAB_00121a65:
      perror(pcVar20);
      return 0;
    }
    uVar21 = fcntl(iVar4,3,0);
    fcntl(iVar4,4,(ulong)(uVar21 | 0x800));
    uVar21 = getpid();
    fcntl(iVar4,8,(ulong)uVar21);
    x = (size_t)iVar4;
    break;
  case 5:
    if ((nameConn & 0xfff0000) == 0xf0000) {
      LVar7 = nameConn | 0xffff0000;
    }
    else if ((nameConn & 0xfff0000) == 0xe0000) {
      LVar7 = nameConn & 0xffff;
    }
    else {
      pLVar13 = NativeAligned4FromLAddr(nameConn);
      LVar7 = *pLVar13;
    }
    pDVar18 = Lisp_world + proto;
    if ((length & 0xfff0000) == 0xf0000) {
      LVar23 = length | 0xffff0000;
    }
    else if ((length & 0xfff0000) == 0xe0000) {
      LVar23 = length & 0xffff;
    }
    else {
      pLVar13 = NativeAligned4FromLAddr(length);
      LVar23 = *pLVar13;
    }
    uVar8 = (int)(LVar23 + 3) >> 2;
    word_swap_page(pDVar18,uVar8);
    sVar12 = send(LVar7,pDVar18,(long)(int)LVar23,0);
    uVar21 = (uint)sVar12;
    word_swap_page(pDVar18,uVar8);
    if ((int)uVar21 < 0) {
      pcVar20 = "TCP send";
      goto LAB_00121a65;
    }
    goto LAB_0012181b;
  case 6:
    if ((nameConn & 0xfff0000) == 0xf0000) {
      LVar7 = nameConn | 0xffff0000;
    }
    else if ((nameConn & 0xfff0000) == 0xe0000) {
      LVar7 = nameConn & 0xffff;
    }
    else {
      pLVar13 = NativeAligned4FromLAddr(nameConn);
      LVar7 = *pLVar13;
    }
    pDVar18 = Lisp_world + proto;
    if ((length & 0xfff0000) == 0xf0000) {
      LVar23 = length | 0xffff0000;
    }
    else if ((length & 0xfff0000) == 0xe0000) {
      LVar23 = length & 0xffff;
    }
    else {
      pLVar13 = NativeAligned4FromLAddr(length);
      LVar23 = *pLVar13;
    }
    sVar12 = read(LVar7,pDVar18,(long)(int)LVar23);
    uVar21 = (uint)sVar12;
    if ((int)uVar21 < 0) {
      piVar14 = __errno_location();
      if (*piVar14 == 0xb) {
        return 0x4c;
      }
      perror("TCP read");
      *Lisp_errno = *piVar14;
      return 0;
    }
    word_swap_page(pDVar18,uVar21 + 3 >> 2);
LAB_0012181b:
    uVar9 = (ulong)(uVar21 & 0x7fffffff);
LAB_0012188f:
    LVar7 = GetSmallp(uVar9);
    return LVar7;
  case 7:
    if ((nameConn & 0xfff0000 | 0x10000) != 0xf0000) {
      pLVar13 = NativeAligned4FromLAddr(nameConn);
      nameConn = *pLVar13;
    }
    iVar4 = socket(2,1,0);
    uVar22 = (ushort)nameConn << 8 | (ushort)nameConn >> 8;
    servstring[2] = (char)uVar22;
    servstring[3] = (char)(uVar22 >> 8);
    servstring[0] = '\x02';
    servstring[1] = '\0';
    servstring[4] = '\0';
    servstring[5] = '\0';
    servstring[6] = '\0';
    servstring[7] = '\0';
    iVar5 = bind(iVar4,(sockaddr *)servstring,0x10);
    if (iVar5 < 0) {
      pcVar20 = "TCP bind";
LAB_00121971:
      perror(pcVar20);
      close(iVar4);
      return 0;
    }
    sigemptyset((sigset_t *)namestring);
    sigaddset((sigset_t *)namestring,0x1d);
    sigprocmask(0,(sigset_t *)namestring,(sigset_t *)0x0);
    uVar21 = fcntl(iVar4,3,0);
    fcntl(iVar4,4,(ulong)(uVar21 | 0x2800));
    uVar21 = getpid();
    fcntl(iVar4,8,(ulong)uVar21);
    iVar5 = listen(iVar4,5);
    if (iVar5 == -1) {
      perror("TCP Listen");
      close(iVar4);
      sigprocmask(1,(sigset_t *)namestring,(sigset_t *)0x0);
      return 0;
    }
    sigprocmask(1,(sigset_t *)namestring,(sigset_t *)0x0);
LAB_00120f60:
    x = (size_t)iVar4;
    uVar9 = 1L << ((byte)iVar4 & 0x3f);
    LispIOFds.__fds_bits[iVar4 / 0x40] = LispIOFds.__fds_bits[iVar4 / 0x40] | uVar9;
    LispReadFds.__fds_bits[iVar4 / 0x40] = LispReadFds.__fds_bits[iVar4 / 0x40] | uVar9;
    break;
  case 8:
    if ((nameConn & 0xfff0000) == 0xf0000) {
      LVar7 = nameConn | 0xffff0000;
    }
    else if ((nameConn & 0xfff0000) == 0xe0000) {
      LVar7 = nameConn & 0xffff;
    }
    else {
      pLVar13 = NativeAligned4FromLAddr(nameConn);
      LVar7 = *pLVar13;
    }
    uVar21 = accept(LVar7,(sockaddr *)0x0,(socklen_t *)0x0);
    if ((int)uVar21 < 0) {
      piVar14 = __errno_location();
      if (*piVar14 == 0xb) {
        return 0;
      }
      pcVar20 = "TCP Accept";
      goto LAB_00121a65;
    }
    uVar8 = fcntl(uVar21,3,0);
    fcntl(uVar21,4,(ulong)(uVar8 | 0x800));
    uVar8 = getpid();
    fcntl(uVar21,8,(ulong)uVar8);
    uVar9 = (ulong)uVar21;
    goto LAB_0012188f;
  default:
    if (uVar21 == 0x40) {
      if ((nameConn & 0xfff0000) == 0xf0000) {
        LVar7 = nameConn | 0xffff0000;
      }
      else if ((nameConn & 0xfff0000) == 0xe0000) {
        LVar7 = nameConn & 0xffff;
      }
      else {
        pLVar13 = NativeAligned4FromLAddr(nameConn);
        LVar7 = *pLVar13;
      }
      pDVar18 = Lisp_world + proto;
      ures = 0x10;
      getpeername(LVar7,(sockaddr *)namestring,&ures);
      phVar10 = gethostbyaddr((sockaddr *)namestring,ures,2);
      strcpy((char *)pDVar18,phVar10->h_name);
      pcVar20 = phVar10->h_name;
    }
    else {
      if (uVar21 != 0x42) {
        if (uVar21 != 0x80) {
          if (uVar21 == 0x82) {
            if ((nameConn & 0xfff0000) == 0xf0000) {
              LVar7 = nameConn | 0xffff0000;
            }
            else if ((nameConn & 0xfff0000) == 0xe0000) {
              LVar7 = nameConn & 0xffff;
            }
            else {
              pLVar13 = NativeAligned4FromLAddr(nameConn);
              LVar7 = *pLVar13;
            }
            servstring[0] = '\x02';
            servstring[1] = '\0';
            if ((length & 0xfff0000 | 0x10000) != 0xf0000) {
              pLVar13 = NativeAligned4FromLAddr(length);
              length = *pLVar13;
            }
            uVar22 = (ushort)length << 8 | (ushort)length >> 8;
            servstring[2] = (char)uVar22;
            servstring[3] = (char)(uVar22 >> 8);
            if ((proto & 0xfff0000) == 0xf0000) {
              LVar23 = proto | 0xffff0000;
            }
            else if ((proto & 0xfff0000) == 0xe0000) {
              LVar23 = proto & 0xffff;
            }
            else {
              pLVar13 = NativeAligned4FromLAddr(proto);
              LVar23 = *pLVar13;
            }
            pDVar18 = Lisp_world + bufaddr;
            uVar21 = LVar23 >> 0x18 | (LVar23 & 0xff0000) >> 8 | (LVar23 & 0xff00) << 8 |
                     LVar23 << 0x18;
            servstring[4] = (char)uVar21;
            servstring[5] = (char)(uVar21 >> 8);
            servstring[6] = (char)(uVar21 >> 0x10);
            servstring[7] = (char)(uVar21 >> 0x18);
            if ((maxlen & 0xfff0000) == 0xf0000) {
              LVar23 = maxlen | 0xffff0000;
            }
            else if ((maxlen & 0xfff0000) == 0xe0000) {
              LVar23 = maxlen & 0xffff;
            }
            else {
              pLVar13 = NativeAligned4FromLAddr(maxlen);
              LVar23 = *pLVar13;
            }
            uVar21 = (int)(LVar23 + 3) >> 2;
            word_swap_page(pDVar18,uVar21);
            sVar12 = sendto(LVar7,pDVar18,(long)(int)LVar23,0,(sockaddr *)servstring,0x10);
            word_swap_page(pDVar18,uVar21);
            if ((int)(uint)sVar12 < 0) {
              perror("UDP Send");
              printf(" fd = %d, addr = 0x%x.\n",(ulong)LVar7,(ulong)servstring._0_8_ >> 0x20);
              return 0;
            }
            x = (size_t)((uint)sVar12 & 0x7fffffff);
          }
          else {
            if (uVar21 != 0x83) {
              return 0;
            }
            if ((nameConn & 0xfff0000) == 0xf0000) {
              LVar7 = nameConn | 0xffff0000;
            }
            else if ((nameConn & 0xfff0000) == 0xe0000) {
              LVar7 = nameConn & 0xffff;
            }
            else {
              pLVar13 = NativeAligned4FromLAddr(nameConn);
              LVar7 = *pLVar13;
            }
            pDVar18 = Lisp_world + proto;
            if ((length & 0xfff0000) == 0xf0000) {
              LVar23 = length | 0xffff0000;
            }
            else if ((length & 0xfff0000) == 0xe0000) {
              LVar23 = length & 0xffff;
            }
            else {
              pLVar13 = NativeAligned4FromLAddr(length);
              LVar23 = *pLVar13;
            }
            ures = 0x10;
            sVar12 = recvfrom(LVar7,pDVar18,(long)(int)LVar23,0,(sockaddr *)servstring,&ures);
            uVar21 = (uint)sVar12;
            if ((int)uVar21 < 0) {
              pcVar20 = "UDP Recv";
              goto LAB_00121a65;
            }
            uVar3 = servstring._4_4_;
            pLVar13 = NativeAligned4FromLAddr(bufaddr);
            *pLVar13 = uVar3;
            uVar2 = servstring._2_2_;
            pLVar13 = NativeAligned4FromLAddr(maxlen);
            *pLVar13 = (uint)(ushort)uVar2;
            word_swap_page(pDVar18,uVar21 + 3 >> 2);
            x = (size_t)(uVar21 & 0x7fffffff);
          }
          break;
        }
        if ((nameConn & 0xfff0000 | 0x10000) != 0xf0000) {
          pLVar13 = NativeAligned4FromLAddr(nameConn);
          nameConn = *pLVar13;
        }
        iVar4 = socket(2,2,0);
        uVar22 = (ushort)nameConn << 8 | (ushort)nameConn >> 8;
        servstring[2] = (char)uVar22;
        servstring[3] = (char)(uVar22 >> 8);
        servstring[0] = '\x02';
        servstring[1] = '\0';
        servstring[4] = '\0';
        servstring[5] = '\0';
        servstring[6] = '\0';
        servstring[7] = '\0';
        iVar5 = bind(iVar4,(sockaddr *)servstring,0x10);
        if (iVar5 < 0) {
          pcVar20 = "UDP bind";
          goto LAB_00121971;
        }
        uVar21 = fcntl(iVar4,3,0);
        fcntl(iVar4,4,(ulong)(uVar21 | 0x2800));
        uVar21 = getpid();
        fcntl(iVar4,8,(ulong)uVar21);
        goto LAB_00120f60;
      }
      if ((nameConn & 0xfff0000) == 0xf0000) {
        LVar7 = nameConn | 0xffff0000;
      }
      else if ((nameConn & 0xfff0000) == 0xe0000) {
        LVar7 = nameConn & 0xffff;
      }
      else {
        pLVar13 = NativeAligned4FromLAddr(nameConn);
        LVar7 = *pLVar13;
      }
      pDVar18 = Lisp_world;
      ures = 0x10;
      namestring._4_4_ =
           LVar7 >> 0x18 | (LVar7 & 0xff0000) >> 8 | (LVar7 & 0xff00) << 8 | LVar7 << 0x18;
      phVar10 = gethostbyaddr(namestring,0x10,0);
      if (phVar10 == (hostent *)0x0) {
        return 0xe0000;
      }
      strcpy((char *)(pDVar18 + proto),phVar10->h_name);
      pcVar20 = phVar10->h_name;
    }
    x = strlen(pcVar20);
  }
  LVar7 = GetSmallp(x);
  return LVar7;
}

Assistant:

LispPTR subr_TCP_ops(int op, LispPTR nameConn, LispPTR proto, LispPTR length, LispPTR bufaddr, LispPTR maxlen)
{
#ifndef DOS
  int sock, len, buflen, res;
  unsigned ures;
  char namestring[100];
  char servstring[50];
  struct sockaddr_in addr;
  struct hostent *host;
  struct servent *service;
  struct sockaddr_in farend;
  int addr_class, protocol;
  DLword *buffer;
  int result;

  switch (op & 0xFFFF) {
    case TCPhostlookup:
      LispStringToCString(nameConn, namestring, 100);
      host = gethostbyname(namestring);
      if (!host) return (NIL);
      res = ntohl(*(in_addr_t *)host->h_addr);
      N_ARITH_SWITCH(res);
      break;

    case TCPservicelookup:
      LispStringToCString(nameConn, namestring, 100);
      LispStringToCString(proto, servstring, 50);
      service = getservbyname(namestring, servstring);
      if (!service) return (NIL);
      return (GetSmallp(ntohs(service->s_port)));

    case TCPsocket:
      addr_class = LispNumToCInt(nameConn);
      protocol = LispNumToCInt(proto);
      result = socket(addr_class, protocol, 0);
#ifndef MAIKO_OS_HAIKU
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_ASYNC | O_NONBLOCK);
#else
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_NONBLOCK);
#endif
#ifdef F_SETOWN
      fcntl(result, F_SETOWN, getpid());
#endif

      return (GetSmallp(result));
    case TCPconnect: /* args: hostname or (fixp)address, socket# */
      memset(&farend, 0, sizeof farend);
      N_GETNUMBER(nameConn, res, string_host);
      farend.sin_addr.s_addr = htonl(res);
      goto host_ok;
    string_host:
      LispStringToCString(nameConn, namestring, 100);
      host = gethostbyname(namestring);
      if (!host) return (NIL);
      memcpy((char *)&farend.sin_addr, (char *)host->h_addr, host->h_length);
    host_ok:
      sock = LispNumToCInt(proto);
      result = socket(AF_INET, SOCK_STREAM, 0);
      farend.sin_family = AF_INET;
      farend.sin_port = htons(sock);
      if (connect(result, (struct sockaddr *)&farend, sizeof farend) < 0) {
        perror("TCP connect");
        return (NIL);
      }
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_NONBLOCK);
#ifdef F_SETOWN
      fcntl(result, F_SETOWN, getpid());
#endif

      return (GetSmallp(result));

    case TCPsend: /* args: conn, buffer, len */
      sock = LispNumToCInt(nameConn);
      buffer = NativeAligned2FromLAddr(proto);
      len = LispNumToCInt(length);
      DBPRINT(("sock: %d, len %d.\n", sock, len));

#ifdef BYTESWAP
      word_swap_page(buffer, (len + 3) >> 2);
#endif /* BYTESWAP */

      result = send(sock, buffer, len, 0);

#ifdef BYTESWAP
      word_swap_page(buffer, (len + 3) >> 2);
#endif /* BYTESWAP */

      if (result < 0) {
        perror("TCP send");
        return (NIL);
      }
      return (GetSmallp(result));

    case TCPrecv: /* args: conn, buffer, maxlen */
      sock = LispNumToCInt(nameConn);
      buffer = NativeAligned2FromLAddr(proto);
      len = LispNumToCInt(length);
      result = read(sock, buffer, len);
      if (result < 0) {
        if (errno == EWOULDBLOCK) return (ATOM_T);
        perror("TCP read");
        *Lisp_errno = errno;
        return (NIL);
      }
#ifdef BYTESWAP
      word_swap_page(buffer, (result + 3) >> 2);
#endif /* BYTESWAP */

      return (GetSmallp(result));

    case TCPclose:
      sock = LispNumToCInt(nameConn);
      FD_CLR(sock, &LispIOFds);
      FD_CLR(sock, &LispReadFds);
      shutdown(sock, 2);
      close(sock);
      return (ATOM_T);

    case TCPListen: /* socket# to listen on */
      sock = LispNumToCInt(nameConn);
      result = socket(AF_INET, SOCK_STREAM, 0);
      farend.sin_family = AF_INET;
      farend.sin_port = htons(sock);
      farend.sin_addr.s_addr = INADDR_ANY;
      if (bind(result, (struct sockaddr *)&farend, sizeof(farend)) < 0) {
        perror("TCP bind");
        close(result);
        return (NIL);
      }
      { /* Do this without taking IO interrupts */
        sigset_t signals;

        sigemptyset(&signals);
#ifndef MAIKO_OS_HAIKU
        sigaddset(&signals, SIGIO);
#endif
        sigprocmask(SIG_BLOCK, &signals, NULL);

#ifndef MAIKO_OS_HAIKU
        fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_ASYNC | O_NONBLOCK);
#else
        fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_NONBLOCK);
#endif

#ifdef F_SETOWN
	fcntl(result, F_SETOWN, getpid());
#endif
        if (listen(result, 5) == -1) {
          perror("TCP Listen");
          close(result);
          sigprocmask(SIG_UNBLOCK, &signals, NULL);
          return (NIL);
        }
        sigprocmask(SIG_UNBLOCK, &signals, NULL);
      }
      FD_SET(result, &LispIOFds);  /* so we get interrupts */
      FD_SET(result, &LispReadFds);
      DBPRINT(("LispIOFds = %p\n", (void *)&LispIOFds));
      return (GetSmallp(result));

    case TCPAccept: /* Socket we're listening on */
      sock = LispNumToCInt(nameConn);
      result = accept(sock, NULL, 0);
      if (result < 0) {
        if (errno != EWOULDBLOCK) perror("TCP Accept");
        return (NIL);
      }
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_NONBLOCK);
#ifdef F_SETOWN
      fcntl(result, F_SETOWN, getpid());
#endif
      return (GetSmallp(result));

    case INETpeername: /* socket#, buffer for name string */
      sock = LispNumToCInt(nameConn);
      buffer = NativeAligned2FromLAddr(proto);
      ures = sizeof(addr);
      getpeername(sock, (struct sockaddr *)&addr, &ures);
      host = gethostbyaddr((const char *)&addr, ures, AF_INET);
      strcpy((char *)buffer, host->h_name);
      return (GetSmallp(strlen(host->h_name)));

    case INETgetname: /* host addr, buffer for name string */
      sock = LispNumToCInt(nameConn);
      buffer = NativeAligned2FromLAddr(proto);
      ures = sizeof(addr);
      addr.sin_addr.s_addr = htonl(sock);
      host = gethostbyaddr((const char *)&addr, ures, 0);
      if (!host) return (GetSmallp(0));
      strcpy((char *)buffer, host->h_name);
      return (GetSmallp(strlen(host->h_name)));

    case UDPListen: /* socket# to listen on */
      sock = LispNumToCInt(nameConn);
      result = socket(AF_INET, SOCK_DGRAM, 0);
      farend.sin_family = AF_INET;
      farend.sin_port = htons(sock);
      farend.sin_addr.s_addr = INADDR_ANY;
      if (bind(result, (struct sockaddr *)&farend, sizeof(farend)) < 0) {
        perror("UDP bind");
        close(result);
        return (NIL);
      }
#ifndef MAIKO_OS_HAIKU
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_ASYNC | O_NONBLOCK);
#else
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_NONBLOCK);
#endif
#ifdef F_SETOWN
      fcntl(result, F_SETOWN, getpid());
#endif
      FD_SET(result, &LispIOFds);  /* so we get interrupts */
      FD_SET(result, &LispReadFds);
      DBPRINT(("LispIOFds = %p\n", (void *)&LispIOFds));
      return (GetSmallp(result));

    case UDPSendto: /* fd-socket# addr remote-socket buffer len*/
      sock = LispNumToCInt(nameConn);
      farend.sin_family = AF_INET;
      farend.sin_port = htons(LispNumToCInt(length));
      farend.sin_addr.s_addr = htonl(LispNumToCInt(proto));
      buffer = NativeAligned2FromLAddr(bufaddr);
      buflen = LispNumToCInt(maxlen);

      DBPRINT(("UDP send:  socket = %d, remote-port = %d.\n", sock, farend.sin_port));
      DBPRINT(("           remote-addr = 0x%x, buflen = %d.\n", farend.sin_addr.s_addr, buflen));

#ifdef BYTESWAP
      word_swap_page(buffer, (buflen + 3) >> 2);
#endif /* BYTESWAP */
      result = sendto(sock, buffer, buflen, 0, (struct sockaddr *)&farend, sizeof farend);
#ifdef BYTESWAP
        word_swap_page(buffer, (buflen + 3) >> 2);
#endif /* BYTESWAP */
      if (result < 0) {
        perror("UDP Send");
        printf(" fd = %d, addr = 0x%x.\n", sock, farend.sin_addr.s_addr);
        return (NIL);
      }
      return (GetSmallp(result));

    case UDPRecvfrom: /* fd-socket# buffer len addr-cell port-cell*/
      sock = LispNumToCInt(nameConn);
      buffer = NativeAligned2FromLAddr(proto);
      buflen = LispNumToCInt(length);
      ures = sizeof farend;
      if ((result = recvfrom(sock, buffer, buflen, 0, (struct sockaddr *)&farend, &ures)) < 0) {
        perror("UDP Recv");
        return (NIL);
      }

      DBPRINT(("UDP recv:  socket = %d, len = %d.\n", sock, result));
      DBPRINT(("           remote-addr = 0x%x, remote-port = %d.\n", ntohl(farend.sin_addr.s_addr),
               ntohs(farend.sin_port)));
      DBPRINT(("           bufsize = %d, addrcell = 0x%x, portcell = 0x%x.\n", buflen, bufaddr,
               maxlen));

      /* XXX NBriggs: 12 Aug 2020 -- WHAT IS GOING ON HERE? */
      *((int *)NativeAligned4FromLAddr(bufaddr)) = (int)farend.sin_addr.s_addr;
      *((int *)NativeAligned4FromLAddr(maxlen)) = (int)farend.sin_port;

#ifdef BYTESWAP
      word_swap_page(buffer, (result + 3) >> 2);
#endif /* BYTESWAP */

      return (GetSmallp(result));

    default: return (NIL);
  }
#endif /* DOS */
}